

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzset_unlocked.c
# Opt level: O3

int zoneinit(state *sp,char *name)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  
  if (sp == (state *)0x0) {
    iVar3 = _PDCLIB_tzload((char *)0x0,&_PDCLIB_lclmem,true);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  else {
    if ((char)sp->leapcnt == '\0') {
      _PDCLIB_lclmem.leapcnt = 0;
      _PDCLIB_lclmem.timecnt = 0;
      _PDCLIB_lclmem.typecnt = 0;
      _PDCLIB_lclmem.charcnt = 0;
      _PDCLIB_lclmem.goback = false;
      _PDCLIB_lclmem.goahead = false;
      _PDCLIB_init_ttinfo(_PDCLIB_lclmem.ttis,0,false,0);
      builtin_strncpy(_PDCLIB_lclmem.chars,"GMT",4);
      _PDCLIB_lclmem.defaulttype = 0;
      return 0;
    }
    iVar3 = _PDCLIB_tzload((char *)sp,&_PDCLIB_lclmem,true);
    if (iVar3 != 0) {
      if ((char)sp->leapcnt == ':') {
        return iVar3;
      }
      _Var2 = _PDCLIB_tzparse((char *)sp,&_PDCLIB_lclmem,false);
      if (!_Var2) {
        return iVar3;
      }
    }
  }
  lVar9 = (long)_PDCLIB_lclmem.charcnt;
  if (0 < lVar9) {
    lVar7 = 0;
    do {
      pvVar5 = memchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789 :+-._",
                      (int)_PDCLIB_lclmem.chars[lVar7],0x45);
      if (pvVar5 == (void *)0x0) {
        _PDCLIB_lclmem.chars[lVar7] = '_';
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  if (0 < _PDCLIB_lclmem.typecnt) {
    piVar8 = &_PDCLIB_lclmem.ttis[0].desigidx;
    lVar9 = 0;
    iVar3 = _PDCLIB_lclmem.typecnt;
    do {
      iVar1 = *piVar8;
      sVar6 = strlen(_PDCLIB_lclmem.chars + iVar1);
      if ((0x10 < sVar6) &&
         (iVar4 = strcmp(_PDCLIB_lclmem.chars + iVar1,
                         "Local time zone must be set--see zic manual page"), iVar4 != 0)) {
        _PDCLIB_lclmem.chars[(long)iVar1 + 0x10] = '\0';
        iVar3 = _PDCLIB_lclmem.typecnt;
      }
      lVar9 = lVar9 + 1;
      piVar8 = piVar8 + 4;
    } while (lVar9 < iVar3);
  }
  return 0;
}

Assistant:

static int zoneinit( struct state * sp, char const * name )
{
    if (name && ! name[0])
    {
        /* User wants it fast rather than right. */
        sp->leapcnt = 0;        /* so, we're off a little */
        sp->timecnt = 0;
        sp->typecnt = 0;
        sp->charcnt = 0;
        sp->goback = sp->goahead = false;
        _PDCLIB_init_ttinfo( &sp->ttis[ 0 ], 0, false, 0 );
        strcpy( sp->chars, gmt );
        sp->defaulttype = 0;
        return 0;
    }
    else
    {
        int err = _PDCLIB_tzload( name, sp, true );

        if ( err != 0 && name && name[ 0 ] != ':' && _PDCLIB_tzparse( name, sp, false ) )
        {
            err = 0;
        }

        if ( err == 0 )
        {
            scrub_abbrs( sp );
        }

        return err;
    }
}